

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

void calc_sum_sse_wd32_avx2
               (uint8_t *src,uint8_t *ref,__m256i set_one_minusone,__m256i *sse_8x16,
               __m256i *sum_8x16)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 in_ZMM0 [64];
  
  auVar4 = vpunpcklbw_avx2(*(undefined1 (*) [32])src,*(undefined1 (*) [32])ref);
  auVar3 = vpunpckhbw_avx2(*(undefined1 (*) [32])src,*(undefined1 (*) [32])ref);
  auVar4 = vpmaddubsw_avx2(auVar4,in_ZMM0._0_32_);
  auVar3 = vpmaddubsw_avx2(auVar3,in_ZMM0._0_32_);
  auVar2 = vpmaddwd_avx2(auVar4,auVar4);
  alVar1 = (__m256i)vpaddd_avx2(auVar2,(undefined1  [32])*sse_8x16);
  *sse_8x16 = alVar1;
  auVar2 = vpmaddwd_avx2(auVar3,auVar3);
  alVar1 = (__m256i)vpaddd_avx2(auVar2,(undefined1  [32])sse_8x16[1]);
  sse_8x16[1] = alVar1;
  alVar1 = (__m256i)vpaddw_avx2(auVar4,(undefined1  [32])*sum_8x16);
  *sum_8x16 = alVar1;
  alVar1 = (__m256i)vpaddw_avx2(auVar3,(undefined1  [32])sum_8x16[1]);
  sum_8x16[1] = alVar1;
  return;
}

Assistant:

static inline void calc_sum_sse_wd32_avx2(const uint8_t *src,
                                          const uint8_t *ref,
                                          __m256i set_one_minusone,
                                          __m256i sse_8x16[2],
                                          __m256i sum_8x16[2]) {
  const __m256i s00_256 = _mm256_loadu_si256((__m256i const *)(src));
  const __m256i r00_256 = _mm256_loadu_si256((__m256i const *)(ref));

  const __m256i u_low_256 = _mm256_unpacklo_epi8(s00_256, r00_256);
  const __m256i u_high_256 = _mm256_unpackhi_epi8(s00_256, r00_256);

  const __m256i diff0 = _mm256_maddubs_epi16(u_low_256, set_one_minusone);
  const __m256i diff1 = _mm256_maddubs_epi16(u_high_256, set_one_minusone);

  sse_8x16[0] = _mm256_add_epi32(sse_8x16[0], _mm256_madd_epi16(diff0, diff0));
  sse_8x16[1] = _mm256_add_epi32(sse_8x16[1], _mm256_madd_epi16(diff1, diff1));
  sum_8x16[0] = _mm256_add_epi16(sum_8x16[0], diff0);
  sum_8x16[1] = _mm256_add_epi16(sum_8x16[1], diff1);
}